

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_of(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValueUnion JVar1;
  int64_t iVar2;
  JSValue val;
  int iVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  JSValueUnion JVar6;
  int64_t *piVar7;
  void *pvVar8;
  JSValue this_obj;
  JSValue JVar9;
  JSValue prop;
  JSValueUnion local_48;
  undefined8 local_40;
  
  JVar6._4_4_ = 0;
  JVar6.int32 = argc;
  local_40 = 0;
  local_48 = JVar6;
  this_obj = js_typed_array_create(ctx,this_val,1,(JSValue *)&local_48);
  JVar4 = this_obj.u;
  if (((uint)this_obj.tag != 6) && (0 < argc)) {
    piVar7 = &argv->tag;
    pvVar8 = (void *)0x0;
    do {
      JVar1 = (JSValueUnion)((JSValueUnion *)(piVar7 + -1))->ptr;
      iVar2 = *piVar7;
      if (0xfffffff4 < (uint)iVar2) {
        *(int *)JVar1.ptr = *JVar1.ptr + 1;
      }
      val.tag = iVar2;
      val.u.ptr = JVar1.ptr;
      prop.tag = 0;
      prop.u.ptr = pvVar8;
      iVar3 = JS_SetPropertyValue(ctx,this_obj,prop,val,0x4000);
      if (iVar3 < 0) {
        if ((0xfffffff4 < (uint)this_obj.tag) &&
           (iVar3 = *JVar4.ptr, *(int *)JVar4.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,this_obj);
        }
        this_obj = (JSValue)(ZEXT816(6) << 0x40);
        uVar5 = 0;
        goto LAB_001710ab;
      }
      pvVar8 = (void *)((long)pvVar8 + 1);
      piVar7 = piVar7 + 2;
    } while (JVar6.ptr != pvVar8);
  }
  uVar5 = (ulong)JVar4.ptr & 0xffffffff00000000;
LAB_001710ab:
  JVar9.u.ptr = (void *)((ulong)this_obj.u.ptr & 0xffffffff | uVar5);
  JVar9.tag = this_obj.tag;
  return JVar9;
}

Assistant:

static JSValue js_typed_array_of(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv)
{
    JSValue obj;
    JSValueConst args[1];
    int i;

    args[0] = JS_NewInt32(ctx, argc);
    obj = js_typed_array_create(ctx, this_val, 1, args);
    if (JS_IsException(obj))
        return obj;

    for(i = 0; i < argc; i++) {
        if (JS_SetPropertyUint32(ctx, obj, i, JS_DupValue(ctx, argv[i])) < 0) {
            JS_FreeValue(ctx, obj);
            return JS_EXCEPTION;
        }
    }
    return obj;
}